

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O2

void ldamath::vexpdigammify(vw *all,float *gamma,float underflow_threshold)

{
  undefined1 (*pauVar1) [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [12];
  undefined1 auVar5 [16];
  float *pfVar6;
  undefined1 (*pauVar7) [16];
  float fVar8;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  float fVar12;
  undefined1 in_XMM1 [16];
  undefined8 uVar13;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  v4sf afVar14;
  v4sf p;
  float local_5c;
  undefined1 local_58 [8];
  float fStack_50;
  float fStack_4c;
  
  pauVar1 = (undefined1 (*) [16])(gamma + all->lda);
  local_5c = 0.0;
  pauVar7 = (undefined1 (*) [16])gamma;
  for (pfVar6 = gamma; (pauVar7 < pauVar1 && (((ulong)pfVar6 & 0xf) != 0)); pfVar6 = pfVar6 + 1) {
    local_5c = local_5c + *(float *)*pauVar7;
    in_XMM1 = ZEXT416((uint)local_5c);
    fVar8 = fastdigamma(*(float *)*pauVar7);
    *(float *)*pauVar7 = fVar8;
    pauVar7 = (undefined1 (*) [16])(*pauVar7 + 4);
  }
  _local_58 = ZEXT816(0);
  while( true ) {
    if ((((ulong)pfVar6 & 0xf) != 0) || (pauVar1 <= pauVar7 + 1)) break;
    auVar2 = *pauVar7;
    fVar8 = (float)local_58._0_4_ + auVar2._0_4_;
    fVar12 = (float)local_58._4_4_ + auVar2._4_4_;
    _local_58 = CONCAT412(fStack_4c + auVar2._12_4_,
                          CONCAT48(fStack_50 + auVar2._8_4_,CONCAT44(fVar12,fVar8)));
    afVar14[2] = fVar8;
    afVar14[3] = fVar12;
    afVar14[0] = (float)(int)auVar2._0_8_;
    afVar14[1] = (float)(int)((ulong)auVar2._0_8_ >> 0x20);
    uVar13 = local_58._8_8_;
    afVar14 = vfastdigamma((ldamath *)all,afVar14);
    in_XMM1._0_8_ = afVar14._8_8_;
    in_XMM1._8_8_ = uVar13;
    auVar2._8_4_ = extraout_XMM0_Dc;
    auVar2._0_8_ = afVar14._0_8_;
    auVar2._12_4_ = extraout_XMM0_Dd;
    *pauVar7 = auVar2;
    pauVar7 = pauVar7 + 1;
  }
  for (; pauVar7 < pauVar1; pauVar7 = (undefined1 (*) [16])(*pauVar7 + 4)) {
    local_5c = local_5c + *(float *)*pauVar7;
    in_XMM1 = ZEXT416((uint)local_5c);
    fVar8 = fastdigamma(*(float *)*pauVar7);
    *(float *)*pauVar7 = fVar8;
  }
  auVar4._4_8_ = in_XMM1._8_8_;
  auVar4._0_4_ = local_58._4_4_;
  auVar9._0_8_ = auVar4._0_8_ << 0x20;
  auVar9._8_4_ = fStack_50;
  auVar9._12_4_ = fStack_4c;
  auVar10._8_8_ = local_58._8_8_;
  auVar10._0_8_ = auVar9._8_8_;
  auVar11._4_12_ = auVar10._4_12_;
  auVar11._0_4_ = fStack_50 + (float)local_58._4_4_ + (float)local_58._0_4_;
  fVar8 = fastdigamma(fStack_4c + auVar11._0_4_ + local_5c);
  for (pfVar6 = gamma; (gamma < pauVar1 && (((ulong)pfVar6 & 0xf) != 0)); pfVar6 = pfVar6 + 1) {
    fVar12 = fastexp(*(float *)*(undefined1 (*) [16])gamma - fVar8);
    auVar11._4_4_ = extraout_XMM0_Db;
    auVar11._0_4_ = fVar12;
    auVar11._8_4_ = extraout_XMM0_Dc_00;
    auVar11._12_4_ = extraout_XMM0_Dd_00;
    fVar12 = fmaxf(underflow_threshold,fVar12);
    *(float *)*(undefined1 (*) [16])gamma = fVar12;
    gamma = (float *)(*(undefined1 (*) [16])gamma + 4);
  }
  while ((((ulong)pfVar6 & 0xf) == 0 && ((undefined1 (*) [16])((long)gamma + 0x10) < pauVar1))) {
    p[0] = *(float *)*(undefined1 (*) [16])gamma - fVar8;
    p[1] = *(float *)(*(undefined1 (*) [16])gamma + 4) - fVar8;
    p._8_8_ = auVar11._0_8_;
    afVar14 = vfastexp((ldamath *)all,p);
    auVar5._4_4_ = underflow_threshold;
    auVar5._0_4_ = underflow_threshold;
    auVar5._8_4_ = underflow_threshold;
    auVar5._12_4_ = underflow_threshold;
    auVar3._8_4_ = extraout_XMM0_Dc_01;
    auVar3._0_8_ = afVar14._0_8_;
    auVar3._12_4_ = extraout_XMM0_Dd_01;
    auVar11 = maxps(auVar5,auVar3);
    *(undefined1 (*) [16])gamma = auVar11;
    gamma = (float *)((long)gamma + 0x10);
  }
  for (; gamma < pauVar1; gamma = (float *)(*(undefined1 (*) [16])gamma + 4)) {
    fVar12 = fastexp(*(float *)*(undefined1 (*) [16])gamma - fVar8);
    fVar12 = fmaxf(underflow_threshold,fVar12);
    *(float *)*(undefined1 (*) [16])gamma = fVar12;
  }
  return;
}

Assistant:

void vexpdigammify(vw &all, float *gamma, const float underflow_threshold)
{
  float extra_sum = 0.0f;
  v4sf sum = v4sfl(0.0f);
  float *fp;
  const float *fpend = gamma + all.lda;

  // Iterate through the initial part of the array that isn't 128-bit SIMD
  // aligned.
  for (fp = gamma; fp < fpend && !is_aligned16(fp); ++fp)
  {
    extra_sum += *fp;
    *fp = fastdigamma(*fp);
  }

  // Rip through the aligned portion...
  for (; is_aligned16(fp) && fp + 4 < fpend; fp += 4)
  {
    v4sf arg = _mm_load_ps(fp);
    sum = sum + arg;
    arg = vfastdigamma(arg);
    _mm_store_ps(fp, arg);
  }

  for (; fp < fpend; ++fp)
  {
    extra_sum += *fp;
    *fp = fastdigamma(*fp);
  }

#if defined(__SSE3__) || defined(__SSE4_1__)
  // Do two horizontal adds on sum, extract the total from the 0 element:
  sum = _mm_hadd_ps(sum, sum);
  sum = _mm_hadd_ps(sum, sum);
  extra_sum += v4sf_index<0>(sum);
#else
  extra_sum += v4sf_index<0>(sum) + v4sf_index<1>(sum) + v4sf_index<2>(sum) + v4sf_index<3>(sum);
#endif

  extra_sum = fastdigamma(extra_sum);
  sum = v4sfl(extra_sum);

  for (fp = gamma; fp < fpend && !is_aligned16(fp); ++fp)
  {
    *fp = fmax(underflow_threshold, fastexp(*fp - extra_sum));
  }

  for (; is_aligned16(fp) && fp + 4 < fpend; fp += 4)
  {
    v4sf arg = _mm_load_ps(fp);
    arg = arg - sum;
    arg = vfastexp(arg);
    arg = _mm_max_ps(v4sfl(underflow_threshold), arg);
    _mm_store_ps(fp, arg);
  }

  for (; fp < fpend; ++fp)
  {
    *fp = fmax(underflow_threshold, fastexp(*fp - extra_sum));
  }
}